

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O0

void __thiscall Fl_Browser_::resize(Fl_Browser_ *this,int X,int Y,int W,int H)

{
  int X_00;
  Fl_Align FVar1;
  int local_54;
  int local_44;
  int local_34;
  int local_20;
  int scrollsize;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Browser_ *this_local;
  
  local_20 = H;
  scrollsize = W;
  H_local = Y;
  W_local = X;
  _Y_local = this;
  if (this->scrollbar_size_ == 0) {
    local_34 = Fl::scrollbar_size();
  }
  else {
    local_34 = this->scrollbar_size_;
  }
  Fl_Widget::resize((Fl_Widget *)this,W_local,H_local,scrollsize,local_20);
  bbox(this,&W_local,&H_local,&scrollsize,&local_20);
  FVar1 = Fl_Widget::align((Fl_Widget *)&this->scrollbar);
  local_44 = scrollsize;
  if ((FVar1 & 4) != 0) {
    local_44 = -local_34;
  }
  local_44 = W_local + local_44;
  Fl_Widget::resize((Fl_Widget *)&this->scrollbar,local_44,H_local,local_34,local_20);
  X_00 = W_local;
  FVar1 = Fl_Widget::align((Fl_Widget *)&this->scrollbar);
  local_54 = local_20;
  if ((FVar1 & 1) != 0) {
    local_54 = -local_34;
  }
  local_54 = H_local + local_54;
  Fl_Widget::resize((Fl_Widget *)&this->hscrollbar,X_00,local_54,scrollsize,local_34);
  this->max_width = 0;
  return;
}

Assistant:

void Fl_Browser_::resize(int X, int Y, int W, int H) {
  int scrollsize = scrollbar_size_ ? scrollbar_size_ : Fl::scrollbar_size();
  Fl_Widget::resize(X, Y, W, H);
  // move the scrollbars so they can respond to events:
  bbox(X,Y,W,H);
  scrollbar.resize(
	scrollbar.align()&FL_ALIGN_LEFT ? X-scrollsize : X+W,
	Y, scrollsize, H);
  hscrollbar.resize(
	X, scrollbar.align()&FL_ALIGN_TOP ? Y-scrollsize : Y+H,
	W, scrollsize);
  max_width = 0;
}